

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int fts5TriTokenize(Fts5Tokenizer *pTok,void *pCtx,int unusedFlags,char *pText,int nText,
                   _func_int_void_ptr_int_char_ptr_int_int_int *xToken)

{
  byte bVar1;
  uint uVar2;
  int iVar3;
  byte *pbVar4;
  uint *puVar5;
  byte *pbVar6;
  byte *pbVar7;
  byte *pbVar8;
  uint uVar9;
  long lVar10;
  ulong uVar11;
  int iVar12;
  byte *pbVar13;
  long in_FS_OFFSET;
  uint *local_90;
  int local_78;
  int local_68 [4];
  undefined8 local_58;
  undefined1 *puStack_50;
  undefined1 *local_48;
  undefined1 *puStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pbVar13 = (byte *)(pText + nText);
  if (pText == (char *)0x0) {
    pbVar13 = (byte *)pText;
  }
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
  local_58 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
  local_68[0] = -0x55555556;
  local_68[1] = -0x55555556;
  local_68[2] = -0x55555556;
  local_90 = (uint *)&local_58;
  lVar10 = 0;
  pbVar4 = (byte *)pText;
  do {
    do {
      local_78 = (int)pText;
      local_68[lVar10] = (int)pbVar4 - local_78;
      if (pbVar13 <= pbVar4) {
        iVar3 = 0;
        goto LAB_001f29be;
      }
      pbVar6 = pbVar4 + 1;
      bVar1 = *pbVar4;
      uVar2 = (uint)bVar1;
      pbVar7 = pbVar6;
      if (0xbf < bVar1) {
        uVar9 = (uint)""[bVar1 - 0xc0];
        if (pbVar6 < pbVar13) {
          pbVar4 = pbVar13 + (-1 - (long)pbVar4);
          do {
            bVar1 = *pbVar6;
            pbVar7 = pbVar6;
            if ((bVar1 & 0xffffffc0) != 0x80) break;
            pbVar6 = pbVar6 + 1;
            uVar9 = bVar1 & 0x3f | uVar9 << 6;
            pbVar4 = pbVar4 + -1;
            pbVar7 = pbVar13;
          } while (pbVar4 != (byte *)0x0);
        }
        uVar2 = uVar9;
        if ((uVar9 & 0xfffff800) == 0xd800) {
          uVar2 = 0xfffd;
        }
        if (uVar9 < 0x80) {
          uVar2 = 0xfffd;
        }
        if ((uVar9 & 0xfffffffe) == 0xfffe) {
          uVar2 = 0xfffd;
        }
      }
      if (*(int *)pTok != 0) {
        uVar2 = sqlite3Fts5UnicodeFold(uVar2,*(int *)(pTok + 4));
      }
      pbVar4 = pbVar7;
    } while (uVar2 == 0);
    bVar1 = (byte)uVar2;
    if (uVar2 < 0x80) {
      *(byte *)local_90 = bVar1;
      local_90 = (uint *)((long)local_90 + 1);
    }
    else if (uVar2 < 0x800) {
      *(byte *)local_90 = (byte)(uVar2 >> 6) | 0xc0;
      *(byte *)((long)local_90 + 1) = bVar1 & 0x3f | 0x80;
      local_90 = (uint *)((long)local_90 + 2);
    }
    else if (uVar2 < 0x10000) {
      *(byte *)local_90 = (byte)(uVar2 >> 0xc) | 0xe0;
      *(byte *)((long)local_90 + 1) = (byte)(uVar2 >> 6) & 0x3f | 0x80;
      *(byte *)((long)local_90 + 2) = bVar1 & 0x3f | 0x80;
      local_90 = (uint *)((long)local_90 + 3);
    }
    else {
      *local_90 = (uVar2 << 0x18 |
                  (uVar2 & 0x3fc0) << 10 | uVar2 >> 0x12 & 0xff | uVar2 >> 4 & 0xff00) &
                  (uint)DAT_00208f00 | (uint)DAT_00208f10;
      local_90 = local_90 + 1;
    }
    lVar10 = lVar10 + 1;
  } while (lVar10 != 3);
LAB_001f27c3:
  pbVar4 = pbVar7;
  if (pbVar4 < pbVar13) goto code_r0x001f27cf;
  uVar11 = 0;
  pbVar7 = pbVar4;
  goto LAB_001f2877;
code_r0x001f27cf:
  pbVar6 = pbVar4 + 1;
  bVar1 = *pbVar4;
  uVar11 = (ulong)bVar1;
  pbVar7 = pbVar6;
  if (0xbf < bVar1) {
    uVar2 = (uint)""[bVar1 - 0xc0];
    if (pbVar6 < pbVar13) {
      pbVar8 = pbVar13 + (-1 - (long)pbVar4);
      do {
        bVar1 = *pbVar6;
        pbVar7 = pbVar6;
        if ((bVar1 & 0xffffffc0) != 0x80) break;
        pbVar6 = pbVar6 + 1;
        uVar2 = bVar1 & 0x3f | uVar2 << 6;
        pbVar8 = pbVar8 + -1;
        pbVar7 = pbVar13;
      } while (pbVar8 != (byte *)0x0);
    }
    uVar11 = (ulong)uVar2;
    if ((uVar2 & 0xfffff800) == 0xd800) {
      uVar11 = 0xfffd;
    }
    if (uVar2 < 0x80) {
      uVar11 = 0xfffd;
    }
    if ((uVar2 & 0xfffffffe) == 0xfffe) {
      uVar11 = 0xfffd;
    }
  }
  if (*(int *)pTok != 0) {
    uVar2 = sqlite3Fts5UnicodeFold((int)uVar11,*(int *)(pTok + 4));
    uVar11 = (ulong)uVar2;
  }
  if ((int)uVar11 != 0) {
LAB_001f2877:
    iVar12 = (int)pbVar4 - local_78;
    iVar3 = (*xToken)(pCtx,0,(char *)&local_58,(int)local_90 - (int)&local_58,local_68[0],iVar12);
    uVar2 = (uint)uVar11;
    if ((uVar2 == 0) || (iVar3 != 0)) {
LAB_001f29be:
      if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
        __stack_chk_fail();
      }
      return iVar3;
    }
    lVar10 = (long)&local_58 + 1;
    __memmove_chk(&local_58,lVar10,(long)local_90 - lVar10,0x20);
    puVar5 = (uint *)(((long)&local_58 - lVar10) + (long)local_90);
    bVar1 = (byte)uVar11;
    if (uVar2 < 0x80) {
      *(byte *)puVar5 = bVar1;
      local_90 = (uint *)((long)puVar5 + 1);
    }
    else if (uVar2 < 0x800) {
      *(byte *)puVar5 = (byte)(uVar11 >> 6) | 0xc0;
      *(byte *)((long)puVar5 + 1) = bVar1 & 0x3f | 0x80;
      local_90 = (uint *)((long)puVar5 + 2);
    }
    else if (uVar2 < 0x10000) {
      *(byte *)puVar5 = (byte)(uVar2 >> 0xc) | 0xe0;
      *(byte *)((long)puVar5 + 1) = (byte)(uVar11 >> 6) & 0x3f | 0x80;
      *(byte *)((long)puVar5 + 2) = bVar1 & 0x3f | 0x80;
      local_90 = (uint *)((long)puVar5 + 3);
    }
    else {
      local_90 = puVar5 + 1;
      *puVar5 = (uVar2 << 0x18 |
                (uVar2 & 0x3fc0) << 10 | uVar2 >> 0x12 & 0xff | (uint)(uVar11 >> 4) & 0xff00) &
                (uint)DAT_00208f00 | (uint)DAT_00208f10;
    }
    local_68[0] = local_68[1];
    local_68[1] = local_68[2];
    local_68[2] = iVar12;
  }
  goto LAB_001f27c3;
}

Assistant:

static int fts5TriTokenize(
  Fts5Tokenizer *pTok,
  void *pCtx,
  int unusedFlags,
  const char *pText, int nText,
  int (*xToken)(void*, int, const char*, int, int, int)
){
  TrigramTokenizer *p = (TrigramTokenizer*)pTok;
  int rc = SQLITE_OK;
  char aBuf[32];
  char *zOut = aBuf;
  int ii;
  const unsigned char *zIn = (const unsigned char*)pText;
  const unsigned char *zEof = (zIn ? &zIn[nText] : 0);
  u32 iCode = 0;
  int aStart[3];                  /* Input offset of each character in aBuf[] */

  UNUSED_PARAM(unusedFlags);

  /* Populate aBuf[] with the characters for the first trigram. */
  for(ii=0; ii<3; ii++){
    do {
      aStart[ii] = zIn - (const unsigned char*)pText;
      if( zIn>=zEof ) return SQLITE_OK;
      READ_UTF8(zIn, zEof, iCode);
      if( p->bFold ) iCode = sqlite3Fts5UnicodeFold(iCode, p->iFoldParam);
    }while( iCode==0 );
    WRITE_UTF8(zOut, iCode);
  }

  /* At the start of each iteration of this loop:
  **
  **  aBuf:      Contains 3 characters. The 3 characters of the next trigram.
  **  zOut:      Points to the byte following the last character in aBuf.
  **  aStart[3]: Contains the byte offset in the input text corresponding
  **             to the start of each of the three characters in the buffer.
  */
  assert( zIn<=zEof );
  while( 1 ){
    int iNext;                    /* Start of character following current tri */
    const char *z1;

    /* Read characters from the input up until the first non-diacritic */
    do {
      iNext = zIn - (const unsigned char*)pText;
      if( zIn>=zEof ){
        iCode = 0;
        break;
      }
      READ_UTF8(zIn, zEof, iCode);
      if( p->bFold ) iCode = sqlite3Fts5UnicodeFold(iCode, p->iFoldParam);
    }while( iCode==0 );

    /* Pass the current trigram back to fts5 */
    rc = xToken(pCtx, 0, aBuf, zOut-aBuf, aStart[0], iNext);
    if( iCode==0 || rc!=SQLITE_OK ) break;

    /* Remove the first character from buffer aBuf[]. Append the character
    ** with codepoint iCode.  */
    z1 = aBuf;
    FTS5_SKIP_UTF8(z1);
    memmove(aBuf, z1, zOut - z1);
    zOut -= (z1 - aBuf);
    WRITE_UTF8(zOut, iCode);

    /* Update the aStart[] array */
    aStart[0] = aStart[1];
    aStart[1] = aStart[2];
    aStart[2] = iNext;
  }

  return rc;
}